

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 SyMemcmp(void *pB1,void *pB2,sxu32 nSize)

{
  int iVar1;
  byte bVar2;
  sxu32 sVar3;
  long lVar4;
  byte bVar5;
  
  if (nSize == 0) {
    return 0;
  }
  if (pB2 == (void *)0x0 || pB1 == (void *)0x0) {
    iVar1 = 1;
    if (pB1 == (void *)0x0) {
      iVar1 = -(uint)(pB2 != (void *)0x0);
    }
    return iVar1;
  }
  lVar4 = 0;
  while( true ) {
    sVar3 = (sxu32)lVar4;
    if (nSize == sVar3) {
      return 0;
    }
    bVar5 = *(byte *)((long)pB1 + lVar4);
    bVar2 = *(byte *)((long)pB2 + lVar4);
    if (bVar5 != bVar2) break;
    if (nSize - 1 == sVar3) {
      return 0;
    }
    bVar5 = *(byte *)((long)pB1 + lVar4 + 1);
    bVar2 = *(byte *)((long)pB2 + lVar4 + 1);
    if (bVar5 != bVar2) break;
    if (nSize - 2 == sVar3) {
      return 0;
    }
    bVar5 = *(byte *)((long)pB1 + lVar4 + 2);
    bVar2 = *(byte *)((long)pB2 + lVar4 + 2);
    if (bVar5 != bVar2) break;
    if (nSize - 3 == sVar3) {
      return 0;
    }
    bVar5 = *(byte *)((long)pB1 + lVar4 + 3);
    bVar2 = *(byte *)((long)pB2 + lVar4 + 3);
    if (bVar5 != bVar2) break;
    lVar4 = lVar4 + 4;
  }
  return (uint)bVar5 - (uint)bVar2;
}

Assistant:

JX9_PRIVATE sxi32 SyMemcmp(const void *pB1, const void *pB2, sxu32 nSize)
{
	sxi32 rc;
	if( nSize <= 0 ){
		return 0;
	}
	if( pB1 == 0 || pB2 == 0 ){
		return pB1 != 0 ? 1 : (pB2 == 0 ? 0 : -1);
	}
	SX_MACRO_FAST_CMP(pB1, pB2, nSize, rc);
	return rc;
}